

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestFail::Run(BuildTestFail *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  int fail_count;
  BuildTestFail *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule fail\n  command = fail\nbuild out1: fail\n",stack0xffffffffffffffe4);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    std::__cxx11::string::string((string *)local_40);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out1",&local_61);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_60,(string *)local_40);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x548,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x549,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      bVar2 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_40);
      testing::Test::Check
                (pTVar1,(bool)(~bVar2 & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x54b,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar6 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x54c,"1u == command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        bVar2 = std::operator==("subcommand failed",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x54d,"\"subcommand failed\" == err");
        if (!bVar2) {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, Fail) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule fail\n"
"  command = fail\n"
"build out1: fail\n"));

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  ASSERT_EQ("subcommand failed", err);
}